

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vpmsumd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  __uint128_t prod [2];
  
  for (uVar2 = 1; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar4 = (ulong)uVar2;
    *(undefined8 *)(prod + uVar4) = 0;
    *(undefined8 *)((long)prod + uVar4 * 0x10 + 8) = 0;
    uVar1 = a->u64[uVar4];
    uVar6 = 0;
    uVar3 = 0;
    for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
      if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
        auVar7 = __ashlti3(b->u64[uVar4],0,uVar5 & 0xff);
        uVar6 = uVar6 ^ auVar7._0_8_;
        uVar3 = uVar3 ^ auVar7._8_8_;
        *(ulong *)((long)prod + uVar4 * 0x10 + 8) = uVar3;
        *(ulong *)(prod + uVar4) = uVar6;
      }
    }
  }
  r->u64[0] = (ulong)prod[1] ^ (ulong)prod[0];
  r->u64[1] = prod[1]._8_8_ ^ prod[0]._8_8_;
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}